

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::LimitingInputStream::Skip(LimitingInputStream *this,int count)

{
  ulong uVar1;
  int in_ESI;
  long in_RDI;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x10) < (long)in_ESI) {
    if (*(long *)(in_RDI + 0x10) < 0) {
      local_1 = false;
    }
    else {
      (**(code **)(**(long **)(in_RDI + 8) + 0x20))
                (*(long **)(in_RDI + 8),*(ulong *)(in_RDI + 0x10) & 0xffffffff);
      *(undefined8 *)(in_RDI + 0x10) = 0;
      local_1 = false;
    }
  }
  else {
    uVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x20))(*(long **)(in_RDI + 8),in_ESI);
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - (long)in_ESI;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool LimitingInputStream::Skip(int count) {
  if (count > limit_) {
    if (limit_ < 0) return false;
    input_->Skip(limit_);
    limit_ = 0;
    return false;
  } else {
    if (!input_->Skip(count)) return false;
    limit_ -= count;
    return true;
  }
}